

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * strip(string *__return_storage_ptr__,string *str,char c)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  char local_21;
  int local_20;
  char current;
  int i;
  char c_local;
  string *str_local;
  
  local_20 = 0;
  current = c;
  _i = str;
  str_local = __return_storage_ptr__;
  while( true ) {
    uVar2 = (ulong)local_20;
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= uVar2) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)_i);
    psVar1 = _i;
    local_21 = *pcVar4;
    if (local_21 == current) {
      local_40._M_current = (char *)std::__cxx11::string::begin();
      local_38 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_40,(long)local_20);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_38);
      std::__cxx11::string::erase(psVar1,local_30);
      local_20 = local_20 + -1;
    }
    local_20 = local_20 + 1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)_i);
  return __return_storage_ptr__;
}

Assistant:

inline string strip(string& str, const char c) {
    for (int i = 0; i < str.length(); ++i) {
        char current = str[i];
        if(current == c) {
            str.erase(str.begin() + i);
            i--;
        }
    }

    return str;
}